

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode cf_socket_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  int *piVar1;
  timediff_t tVar2;
  curltime older;
  curltime newer;
  CURLcode local_5c;
  int local_58;
  curltime *when;
  timediff_t ms;
  cf_socket_ctx *ctx;
  void *pres2_local;
  int *pres1_local;
  int query_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  piVar1 = (int *)cf->ctx;
  if (query == 2) {
    if ((*(byte *)(piVar1 + 0x5f) & 1) == 0) {
      *pres1 = -1;
    }
    else {
      older._12_4_ = 0;
      older._0_12_ = *(undefined1 (*) [12])(piVar1 + 0x52);
      newer._12_4_ = 0;
      newer._0_12_ = *(undefined1 (*) [12])(piVar1 + 0x5a);
      tVar2 = Curl_timediff(newer,older);
      if (tVar2 < 0x7fffffff) {
        local_58 = (int)tVar2;
      }
      else {
        local_58 = 0x7fffffff;
      }
      *pres1 = local_58;
    }
    cf_local._4_4_ = CURLE_OK;
  }
  else if (query == 3) {
    *(int *)pres2 = piVar1[0x26];
    cf_local._4_4_ = CURLE_OK;
  }
  else if (query == 4) {
    if ((*piVar1 == 4 || *piVar1 == 5) && ((*(byte *)(piVar1 + 0x5f) & 1) != 0)) {
      *(undefined8 *)pres2 = *(undefined8 *)(piVar1 + 0x5a);
      *(undefined8 *)((long)pres2 + 8) = *(undefined8 *)(piVar1 + 0x5c);
    }
    else {
      *(undefined8 *)pres2 = *(undefined8 *)(piVar1 + 0x56);
      *(undefined8 *)((long)pres2 + 8) = *(undefined8 *)(piVar1 + 0x58);
    }
    cf_local._4_4_ = CURLE_OK;
  }
  else {
    if (cf->next == (Curl_cfilter *)0x0) {
      local_5c = CURLE_UNKNOWN_OPTION;
    }
    else {
      local_5c = (*cf->next->cft->query)(cf->next,data,query,pres1,pres2);
    }
    cf_local._4_4_ = local_5c;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode cf_socket_query(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                int query, int *pres1, void *pres2)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  switch(query) {
  case CF_QUERY_SOCKET:
    DEBUGASSERT(pres2);
    *((curl_socket_t *)pres2) = ctx->sock;
    return CURLE_OK;
  case CF_QUERY_CONNECT_REPLY_MS:
    if(ctx->got_first_byte) {
      timediff_t ms = Curl_timediff(ctx->first_byte_at, ctx->started_at);
      *pres1 = (ms < INT_MAX)? (int)ms : INT_MAX;
    }
    else
      *pres1 = -1;
    return CURLE_OK;
  case CF_QUERY_TIMER_CONNECT: {
    struct curltime *when = pres2;
    switch(ctx->transport) {
    case TRNSPRT_UDP:
    case TRNSPRT_QUIC:
      /* Since UDP connected sockets work different from TCP, we use the
       * time of the first byte from the peer as the "connect" time. */
      if(ctx->got_first_byte) {
        *when = ctx->first_byte_at;
        break;
      }
      FALLTHROUGH();
    default:
      *when = ctx->connected_at;
      break;
    }
    return CURLE_OK;
  }
  default:
    break;
  }
  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}